

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rigid-body-kinematics.hxx
# Opt level: O0

Kinematics * __thiscall
stateObservation::kine::Kinematics::setToProductNoAlias
          (Kinematics *__return_storage_ptr__,Kinematics *this,Kinematics *multiplier1,
          Kinematics *multiplier2)

{
  bool bVar1;
  bool bVar2;
  Orientation *pOVar3;
  Matrix<double,_3,_1,_0,_3,_1> *pMVar4;
  MatrixBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_> *pMVar5;
  MatrixBase<Eigen::Matrix<double,3,1,0,3,1>> *pMVar6;
  Matrix<double,_3,_1,_0,_3,_1> *local_188;
  type local_180;
  Matrix<double,_3,_1,_0,_3,_1> *local_168;
  Vector3 local_160;
  Matrix<double,_3,_1,_0,_3,_1> *local_148;
  Vector3 local_140;
  MatrixBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_> *local_128;
  Vector3 *R1w2;
  CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>
  local_118;
  type local_100;
  Matrix<double,_3,_1,_0,_3,_1> *local_e8;
  type local_e0;
  Matrix<double,_3,_1,_0,_3,_1> *local_c8;
  Vector3 local_c0;
  MatrixBase<Eigen::Matrix<double,3,1,0,3,1>> *local_a8;
  Vector3 *w1xR1p2_R1p2d;
  type local_98;
  MatrixBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_> *local_80;
  Vector3 *w1xR1p2;
  Vector3 local_70;
  MatrixBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_> *local_58;
  Vector3 *R1p2d;
  Vector3 local_48;
  MatrixBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_> *local_30;
  Vector3 *R1p2;
  Kinematics *multiplier2_local;
  Kinematics *multiplier1_local;
  Kinematics *this_local;
  
  R1p2 = (Vector3 *)multiplier2;
  multiplier2_local = multiplier1;
  multiplier1_local = this;
  this_local = __return_storage_ptr__;
  bVar1 = Orientation::isSet(&multiplier1->orientation);
  if (!bVar1) {
    __assert_fail("multiplier1.orientation.isSet() && \"The multiplier 1 orientation is not initialized, the multiplication is not possible.\""
                  ,
                  "/workspace/llm4binary/github/license_c_cmakelists/mehdi-benallegue[P]state-observation/include/state-observation/tools/rigid-body-kinematics.hxx"
                  ,0x67d,
                  "Kinematics stateObservation::kine::Kinematics::setToProductNoAlias(const Kinematics &, const Kinematics &)"
                 );
  }
  bVar1 = CheckedItem<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_false,_false,_true,_true>::isSet
                    ((CheckedItem<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_false,_false,_true,_true> *)
                     R1p2);
  if (!bVar1) {
    bVar2 = Orientation::isSet((Orientation *)
                               (R1p2[2].super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>
                                .m_storage.m_data.array + 2));
    bVar1 = false;
    if (!bVar2) goto LAB_0012e651;
  }
  bVar1 = true;
LAB_0012e651:
  if (bVar1) {
    bVar1 = CheckedItem<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_false,_false,_true,_true>::isSet
                      ((CheckedItem<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_false,_false,_true,_true>
                        *)R1p2);
    if ((bVar1) &&
       (bVar1 = CheckedItem<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_false,_false,_true,_true>::isSet
                          (&multiplier2_local->position), bVar1)) {
      CheckedItem<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_false,_false,_true,_true>::set
                (&this->position,true);
      local_30 = (MatrixBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_> *)
                 CheckedItem<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_false,_false,_true,_true>::
                 operator()(&this->position);
      pOVar3 = &multiplier2_local->orientation;
      pMVar4 = CheckedItem<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_false,_false,_true,_true>::
               operator()((CheckedItem<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_false,_false,_true,_true>
                           *)R1p2);
      Orientation::operator*(&local_48,pOVar3,pMVar4);
      R1p2d = (Vector3 *)Eigen::MatrixBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>::noalias(local_30)
      ;
      Eigen::NoAlias<Eigen::Matrix<double,3,1,0,3,1>,Eigen::MatrixBase>::operator=
                ((NoAlias<Eigen::Matrix<double,3,1,0,3,1>,Eigen::MatrixBase> *)&R1p2d,
                 (MatrixBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_> *)&local_48);
      bVar1 = CheckedItem<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_false,_false,_true,_true>::isSet
                        ((CheckedItem<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_false,_false,_true,_true>
                          *)(R1p2 + 10));
      if ((bVar1) &&
         ((bVar1 = CheckedItem<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_false,_false,_true,_true>::
                   isSet(&multiplier2_local->linVel), bVar1 &&
          (bVar1 = CheckedItem<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_false,_false,_true,_true>::
                   isSet(&multiplier2_local->angVel), bVar1)))) {
        local_58 = (MatrixBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_> *)&this->tempVec_;
        pOVar3 = &multiplier2_local->orientation;
        pMVar4 = CheckedItem<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_false,_false,_true,_true>::
                 operator()((CheckedItem<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_false,_false,_true,_true>
                             *)(R1p2 + 10));
        Orientation::operator*(&local_70,pOVar3,pMVar4);
        w1xR1p2 = (Vector3 *)
                  Eigen::MatrixBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>::noalias(local_58);
        Eigen::NoAlias<Eigen::Matrix<double,3,1,0,3,1>,Eigen::MatrixBase>::operator=
                  ((NoAlias<Eigen::Matrix<double,3,1,0,3,1>,Eigen::MatrixBase> *)&w1xR1p2,
                   (MatrixBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_> *)&local_70);
        CheckedItem<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_false,_false,_true,_true>::set
                  (&this->linVel,true);
        local_80 = (MatrixBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_> *)
                   CheckedItem<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_false,_false,_true,_true>::
                   operator()(&this->linVel);
        pMVar6 = (MatrixBase<Eigen::Matrix<double,3,1,0,3,1>> *)
                 CheckedItem<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_false,_false,_true,_true>::
                 operator()(&multiplier2_local->angVel);
        Eigen::MatrixBase<Eigen::Matrix<double,3,1,0,3,1>>::cross<Eigen::Matrix<double,3,1,0,3,1>>
                  (&local_98,pMVar6,local_30);
        w1xR1p2_R1p2d =
             (Vector3 *)Eigen::MatrixBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>::noalias(local_80);
        Eigen::NoAlias<Eigen::Matrix<double,3,1,0,3,1>,Eigen::MatrixBase>::operator=
                  ((NoAlias<Eigen::Matrix<double,3,1,0,3,1>,Eigen::MatrixBase> *)&w1xR1p2_R1p2d,
                   (MatrixBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_> *)&local_98);
        local_a8 = (MatrixBase<Eigen::Matrix<double,3,1,0,3,1>> *)local_80;
        Eigen::MatrixBase<Eigen::Matrix<double,3,1,0,3,1>>::operator+=
                  ((MatrixBase<Eigen::Matrix<double,3,1,0,3,1>> *)local_80,local_58);
        bVar1 = CheckedItem<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_false,_false,_true,_true>::isSet
                          ((CheckedItem<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_false,_false,_true,_true>
                            *)(R1p2[0xe].
                               super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.
                               m_storage.m_data.array + 2));
        if ((bVar1) &&
           ((bVar1 = CheckedItem<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_false,_false,_true,_true>::
                     isSet(&multiplier2_local->linAcc), bVar1 &&
            (bVar1 = CheckedItem<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_false,_false,_true,_true>::
                     isSet(&multiplier2_local->angAcc), bVar1)))) {
          CheckedItem<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_false,_false,_true,_true>::set
                    (&this->linAcc,true);
          pOVar3 = &multiplier2_local->orientation;
          pMVar4 = CheckedItem<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_false,_false,_true,_true>::
                   operator()((CheckedItem<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_false,_false,_true,_true>
                               *)(R1p2[0xe].
                                  super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.
                                  m_storage.m_data.array + 2));
          Orientation::operator*(&local_c0,pOVar3,pMVar4);
          pMVar5 = (MatrixBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_> *)
                   CheckedItem<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_false,_false,_true,_true>::
                   operator()(&this->linAcc);
          local_c8 = (Matrix<double,_3,_1,_0,_3,_1> *)
                     Eigen::MatrixBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>::noalias(pMVar5);
          Eigen::NoAlias<Eigen::Matrix<double,3,1,0,3,1>,Eigen::MatrixBase>::operator=
                    ((NoAlias<Eigen::Matrix<double,3,1,0,3,1>,Eigen::MatrixBase> *)&local_c8,
                     (MatrixBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_> *)&local_c0);
          pMVar6 = (MatrixBase<Eigen::Matrix<double,3,1,0,3,1>> *)
                   CheckedItem<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_false,_false,_true,_true>::
                   operator()(&multiplier2_local->angAcc);
          Eigen::MatrixBase<Eigen::Matrix<double,3,1,0,3,1>>::cross<Eigen::Matrix<double,3,1,0,3,1>>
                    (&local_e0,pMVar6,local_30);
          pMVar5 = (MatrixBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_> *)
                   CheckedItem<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_false,_false,_true,_true>::
                   operator()(&this->linAcc);
          local_e8 = (Matrix<double,_3,_1,_0,_3,_1> *)
                     Eigen::MatrixBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>::noalias(pMVar5);
          Eigen::NoAlias<Eigen::Matrix<double,3,1,0,3,1>,Eigen::MatrixBase>::operator+=
                    ((NoAlias<Eigen::Matrix<double,3,1,0,3,1>,Eigen::MatrixBase> *)&local_e8,
                     (MatrixBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_> *)&local_e0);
          pMVar6 = (MatrixBase<Eigen::Matrix<double,3,1,0,3,1>> *)
                   CheckedItem<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_false,_false,_true,_true>::
                   operator()(&multiplier2_local->angVel);
          Eigen::MatrixBase<Eigen::Matrix<double,3,1,0,3,1>>::operator+
                    (&local_118,local_a8,local_58);
          Eigen::MatrixBase<Eigen::Matrix<double,3,1,0,3,1>>::
          cross<Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::Matrix<double,3,1,0,3,1>const,Eigen::Matrix<double,3,1,0,3,1>const>>
                    (&local_100,pMVar6,
                     (MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
                      *)&local_118);
          pMVar5 = (MatrixBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_> *)
                   CheckedItem<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_false,_false,_true,_true>::
                   operator()(&this->linAcc);
          R1w2 = (Vector3 *)
                 Eigen::MatrixBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>::noalias(pMVar5);
          Eigen::NoAlias<Eigen::Matrix<double,3,1,0,3,1>,Eigen::MatrixBase>::operator+=
                    ((NoAlias<Eigen::Matrix<double,3,1,0,3,1>,Eigen::MatrixBase> *)&R1w2,
                     (MatrixBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_> *)&local_100);
          pMVar5 = (MatrixBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_> *)
                   CheckedItem<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_false,_false,_true,_true>::
                   operator()(&multiplier2_local->linAcc);
          pMVar6 = (MatrixBase<Eigen::Matrix<double,3,1,0,3,1>> *)
                   CheckedItem<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_false,_false,_true,_true>::
                   operator()(&this->linAcc);
          Eigen::MatrixBase<Eigen::Matrix<double,3,1,0,3,1>>::operator+=(pMVar6,pMVar5);
        }
        else {
          CheckedItem<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_false,_false,_true,_true>::reset
                    (&this->linAcc);
        }
        pMVar5 = (MatrixBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_> *)
                 CheckedItem<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_false,_false,_true,_true>::
                 operator()(&multiplier2_local->linVel);
        pMVar6 = (MatrixBase<Eigen::Matrix<double,3,1,0,3,1>> *)
                 CheckedItem<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_false,_false,_true,_true>::
                 operator()(&this->linVel);
        Eigen::MatrixBase<Eigen::Matrix<double,3,1,0,3,1>>::operator+=(pMVar6,pMVar5);
      }
      else {
        CheckedItem<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_false,_false,_true,_true>::reset
                  (&this->linVel);
        CheckedItem<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_false,_false,_true,_true>::reset
                  (&this->linAcc);
      }
      pMVar5 = (MatrixBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_> *)
               CheckedItem<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_false,_false,_true,_true>::
               operator()(&multiplier2_local->position);
      pMVar6 = (MatrixBase<Eigen::Matrix<double,3,1,0,3,1>> *)
               CheckedItem<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_false,_false,_true,_true>::
               operator()(&this->position);
      Eigen::MatrixBase<Eigen::Matrix<double,3,1,0,3,1>>::operator+=(pMVar6,pMVar5);
    }
    else {
      CheckedItem<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_false,_false,_true,_true>::reset
                (&this->position);
      CheckedItem<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_false,_false,_true,_true>::reset
                (&this->linVel);
      CheckedItem<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_false,_false,_true,_true>::reset
                (&this->linAcc);
    }
    bVar1 = Orientation::isSet((Orientation *)
                               (R1p2[2].super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>
                                .m_storage.m_data.array + 2));
    if (bVar1) {
      Orientation::setToProductNoAlias
                (&this->orientation,&multiplier2_local->orientation,
                 (Orientation *)
                 (R1p2[2].super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.
                  m_data.array + 2));
      bVar1 = CheckedItem<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_false,_false,_true,_true>::isSet
                        ((CheckedItem<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_false,_false,_true,_true>
                          *)(R1p2[0xc].super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.
                             m_storage.m_data.array + 1));
      if ((bVar1) &&
         (bVar1 = CheckedItem<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_false,_false,_true,_true>::isSet
                            (&multiplier2_local->angVel), bVar1)) {
        CheckedItem<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_false,_false,_true,_true>::set
                  (&this->angVel,true);
        local_128 = (MatrixBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_> *)
                    CheckedItem<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_false,_false,_true,_true>::
                    operator()(&this->angVel);
        pOVar3 = &multiplier2_local->orientation;
        pMVar4 = CheckedItem<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_false,_false,_true,_true>::
                 operator()((CheckedItem<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_false,_false,_true,_true>
                             *)(R1p2[0xc].
                                super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.
                                m_storage.m_data.array + 1));
        Orientation::operator*(&local_140,pOVar3,pMVar4);
        local_148 = (Matrix<double,_3,_1,_0,_3,_1> *)
                    Eigen::MatrixBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>::noalias(local_128);
        Eigen::NoAlias<Eigen::Matrix<double,3,1,0,3,1>,Eigen::MatrixBase>::operator=
                  ((NoAlias<Eigen::Matrix<double,3,1,0,3,1>,Eigen::MatrixBase> *)&local_148,
                   (MatrixBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_> *)&local_140);
        bVar1 = CheckedItem<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_false,_false,_true,_true>::isSet
                          ((CheckedItem<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_false,_false,_true,_true>
                            *)(R1p2 + 0x11));
        if ((bVar1) &&
           (bVar1 = CheckedItem<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_false,_false,_true,_true>::
                    isSet(&multiplier2_local->angAcc), bVar1)) {
          CheckedItem<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_false,_false,_true,_true>::set
                    (&this->angAcc,true);
          pOVar3 = &multiplier2_local->orientation;
          pMVar4 = CheckedItem<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_false,_false,_true,_true>::
                   operator()((CheckedItem<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_false,_false,_true,_true>
                               *)(R1p2 + 0x11));
          Orientation::operator*(&local_160,pOVar3,pMVar4);
          pMVar5 = (MatrixBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_> *)
                   CheckedItem<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_false,_false,_true,_true>::
                   operator()(&this->angAcc);
          local_168 = (Matrix<double,_3,_1,_0,_3,_1> *)
                      Eigen::MatrixBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>::noalias(pMVar5);
          Eigen::NoAlias<Eigen::Matrix<double,3,1,0,3,1>,Eigen::MatrixBase>::operator=
                    ((NoAlias<Eigen::Matrix<double,3,1,0,3,1>,Eigen::MatrixBase> *)&local_168,
                     (MatrixBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_> *)&local_160);
          pMVar6 = (MatrixBase<Eigen::Matrix<double,3,1,0,3,1>> *)
                   CheckedItem<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_false,_false,_true,_true>::
                   operator()(&multiplier2_local->angVel);
          Eigen::MatrixBase<Eigen::Matrix<double,3,1,0,3,1>>::cross<Eigen::Matrix<double,3,1,0,3,1>>
                    (&local_180,pMVar6,local_128);
          pMVar5 = (MatrixBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_> *)
                   CheckedItem<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_false,_false,_true,_true>::
                   operator()(&this->angAcc);
          local_188 = (Matrix<double,_3,_1,_0,_3,_1> *)
                      Eigen::MatrixBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>::noalias(pMVar5);
          Eigen::NoAlias<Eigen::Matrix<double,3,1,0,3,1>,Eigen::MatrixBase>::operator+=
                    ((NoAlias<Eigen::Matrix<double,3,1,0,3,1>,Eigen::MatrixBase> *)&local_188,
                     (MatrixBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_> *)&local_180);
          pMVar5 = (MatrixBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_> *)
                   CheckedItem<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_false,_false,_true,_true>::
                   operator()(&multiplier2_local->angAcc);
          pMVar6 = (MatrixBase<Eigen::Matrix<double,3,1,0,3,1>> *)
                   CheckedItem<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_false,_false,_true,_true>::
                   operator()(&this->angAcc);
          Eigen::MatrixBase<Eigen::Matrix<double,3,1,0,3,1>>::operator+=(pMVar6,pMVar5);
        }
        else {
          CheckedItem<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_false,_false,_true,_true>::reset
                    (&this->angAcc);
        }
        pMVar5 = (MatrixBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_> *)
                 CheckedItem<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_false,_false,_true,_true>::
                 operator()(&multiplier2_local->angVel);
        pMVar6 = (MatrixBase<Eigen::Matrix<double,3,1,0,3,1>> *)
                 CheckedItem<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_false,_false,_true,_true>::
                 operator()(&this->angVel);
        Eigen::MatrixBase<Eigen::Matrix<double,3,1,0,3,1>>::operator+=(pMVar6,pMVar5);
      }
      else {
        CheckedItem<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_false,_false,_true,_true>::reset
                  (&this->angVel);
        CheckedItem<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_false,_false,_true,_true>::reset
                  (&this->angAcc);
      }
    }
    else {
      Orientation::reset(&this->orientation);
      CheckedItem<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_false,_false,_true,_true>::reset
                (&this->angVel);
      CheckedItem<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_false,_false,_true,_true>::reset
                (&this->angAcc);
    }
    Kinematics(__return_storage_ptr__,this);
    return __return_storage_ptr__;
  }
  __assert_fail("(multiplier2.position.isSet() || multiplier2.orientation.isSet()) && \"The multiplier 2 kinematics is not initialized, the multiplication is not possible.\""
                ,
                "/workspace/llm4binary/github/license_c_cmakelists/mehdi-benallegue[P]state-observation/include/state-observation/tools/rigid-body-kinematics.hxx"
                ,0x680,
                "Kinematics stateObservation::kine::Kinematics::setToProductNoAlias(const Kinematics &, const Kinematics &)"
               );
}

Assistant:

inline Kinematics Kinematics::setToProductNoAlias(const Kinematics & multiplier1, const Kinematics & multiplier2)
{
  BOOST_ASSERT(multiplier1.orientation.isSet()
               && "The multiplier 1 orientation is not initialized, the multiplication is not possible.");

  BOOST_ASSERT((multiplier2.position.isSet() || multiplier2.orientation.isSet())
               && "The multiplier 2 kinematics is not initialized, the multiplication is not possible.");

  if(multiplier2.position.isSet() && multiplier1.position.isSet())
  {
    position.set(true);
    Vector3 & R1p2 = position(); /// reference ( Vector3&  )
    R1p2.noalias() = multiplier1.orientation * multiplier2.position();

    if(multiplier2.linVel.isSet() && multiplier1.linVel.isSet() && multiplier1.angVel.isSet())
    {
      Vector3 & R1p2d = tempVec_; /// reference
      R1p2d.noalias() = multiplier1.orientation * multiplier2.linVel();

      linVel.set(true);
      Vector3 & w1xR1p2 = linVel(); /// reference
      w1xR1p2.noalias() = multiplier1.angVel().cross(R1p2);

      Vector3 & w1xR1p2_R1p2d = w1xR1p2; ///  reference ( =linVel() )
      w1xR1p2_R1p2d += R1p2d;

      if(multiplier2.linAcc.isSet() && multiplier1.linAcc.isSet() && multiplier1.angAcc.isSet())
      {
        linAcc.set(true);
        linAcc().noalias() = multiplier1.orientation * multiplier2.linAcc();
        linAcc().noalias() += multiplier1.angAcc().cross(R1p2);
        linAcc().noalias() += multiplier1.angVel().cross(w1xR1p2_R1p2d + R1p2d);
        linAcc() += multiplier1.linAcc();
      }
      else
      {
        linAcc.reset();
      }

      linVel() += multiplier1.linVel();
    }
    else
    {
      linVel.reset();
      linAcc.reset();
    }

    position() += multiplier1.position();
  }
  else
  {
    position.reset();
    linVel.reset();
    linAcc.reset();
  }

  if(multiplier2.orientation.isSet())
  {
    orientation.setToProductNoAlias(multiplier1.orientation, multiplier2.orientation);

    if(multiplier2.angVel.isSet() && multiplier1.angVel.isSet())
    {
      angVel.set(true);
      Vector3 & R1w2 = angVel(); /// reference
      R1w2.noalias() = multiplier1.orientation * multiplier2.angVel();

      if(multiplier2.angAcc.isSet() && multiplier1.angAcc.isSet())
      {
        angAcc.set(true);
        angAcc().noalias() = multiplier1.orientation * multiplier2.angAcc();
        angAcc().noalias() += multiplier1.angVel().cross(R1w2);
        angAcc() += multiplier1.angAcc();
      }
      else
      {
        angAcc.reset();
      }

      angVel() += multiplier1.angVel();
    }
    else
    {
      angVel.reset();
      angAcc.reset();
    }
  }
  else
  {
    orientation.reset();
    angVel.reset();
    angAcc.reset();
  }

  return *this;
}